

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cpp
# Opt level: O1

hash_t duckdb::HashBytes<false>(const_data_ptr_t ptr,idx_t len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  hash_t hr;
  ulong local_20;
  
  uVar3 = len * -0x395b586ca42e166b ^ 0xe17a1465;
  uVar1 = (ulong)((uint)len & 7);
  if (ptr + (len - uVar1) != ptr) {
    uVar2 = len & 0xfffffffffffffff8;
    do {
      uVar3 = (uVar3 ^ *(ulong *)ptr) * -0x2917014799a6026d;
      ptr = (const_data_ptr_t)((long)ptr + 8);
      uVar2 = uVar2 - 8;
    } while (uVar2 != 0);
  }
  if (uVar1 != 0) {
    local_20 = 0;
    switchD_012dd528::default(&local_20,ptr,uVar1);
    uVar3 = (uVar3 ^ local_20) * -0x2917014799a6026d;
  }
  uVar1 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
  uVar1 = (uVar1 >> 0x20 ^ uVar1) * -0x2917014799a6026d;
  return uVar1 >> 0x20 ^ uVar1;
}

Assistant:

hash_t HashBytes(const_data_ptr_t ptr, const idx_t len) noexcept {
	// This seed slightly improves bit distribution, taken from here:
	// https://github.com/martinus/robin-hood-hashing/blob/3.11.5/LICENSE
	// MIT License Copyright (c) 2018-2021 Martin Ankerl
	hash_t h = 0xe17a1465U ^ (len * 0xc6a4a7935bd1e995U);

	// Hash/combine in blocks of 8 bytes
	const auto remainder = len & 7U;
	for (const auto end = ptr + len - remainder; ptr != end; ptr += 8U) {
		h ^= Load<hash_t>(ptr);
		h *= 0xd6e8feb86659fd93U;
	}

	if (remainder != 0) {
		if (AT_LEAST_8_BYTES) {
			D_ASSERT(len >= 8);
			// Load remaining (<8) bytes (with a Load instead of a memcpy)
			const auto inv_rem = 8U - remainder;
			const auto hr = Load<hash_t>(ptr - inv_rem) >> (inv_rem * 8U);

			h ^= hr;
			h *= 0xd6e8feb86659fd93U;
		} else {
			// Load remaining (<8) bytes (with a memcpy)
			hash_t hr = 0;
			memcpy(&hr, ptr, remainder);

			h ^= hr;
			h *= 0xd6e8feb86659fd93U;
		}
	}

	// Finalize
	return Hash(h);
}